

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmFormatter::buffer_char(CVmFormatter *this,wchar_t c)

{
  wchar_t *pwVar1;
  CCharmapToLocal *pCVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  pCVar2 = this->cmap_;
  if (this->cmap_ == (CCharmapToLocal *)0x0) {
    pCVar2 = G_cmap_to_ui_X;
  }
  if ((pCVar2->exp_map_[(ulong)((uint)c >> 8) & 0xff] != (uint *)0x0) &&
     (uVar3 = (ulong)pCVar2->exp_map_[(ulong)((uint)c >> 8) & 0xff][(ulong)(uint)c & 0xff],
     uVar3 != 0)) {
    pwVar1 = pCVar2->exp_array_;
    lVar5 = (long)pwVar1[uVar3];
    if (lVar5 != 0) {
      lVar4 = 0;
      do {
        buffer_expchar(this,pwVar1[uVar3 + lVar4 + 1]);
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
    return;
  }
  buffer_expchar(this,c);
  return;
}

Assistant:

void CVmFormatter::buffer_char(VMG_ wchar_t c)
{
    const wchar_t *exp;
    size_t exp_len;

    /* check for a display expansion */
    exp = (cmap_ != 0 ? cmap_ : G_cmap_to_ui)->get_expansion(c, &exp_len);
    if (exp != 0)
    {
        /* write each character of the expansion */
        for ( ; exp_len != 0 ; ++exp, --exp_len)
            buffer_expchar(vmg_ *exp);
    }
    else
    {
        /* there's no expansion - buffer the character as-is */
        buffer_expchar(vmg_ c);
    }
}